

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O3

char * string_join(char *base,...)

{
  char in_AL;
  size_t sVar1;
  ulong uVar2;
  void **ppvVar3;
  size_t sVar4;
  char *__dest;
  void **ppvVar5;
  uint uVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  uint local_108;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  ppvVar5 = &args[0].overflow_arg_area;
  local_e8[1] = (void *)in_RSI;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar1 = strlen(base);
  local_108 = 8;
  while( true ) {
    if (local_108 < 0x29) {
      uVar2 = (ulong)local_108;
      local_108 = local_108 + 8;
      ppvVar3 = (void **)((long)local_e8 + uVar2);
    }
    else {
      ppvVar3 = ppvVar5;
      ppvVar5 = ppvVar5 + 1;
    }
    if ((char *)*ppvVar3 == (char *)0x0) break;
    sVar4 = strlen((char *)*ppvVar3);
    sVar1 = sVar1 + sVar4;
  }
  __dest = (char *)__ckd_calloc__(sVar1 + 1,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/strfuncs.c"
                                  ,0x55);
  uVar6 = 8;
  local_100 = &args[0].overflow_arg_area;
  strcpy(__dest,base);
  while( true ) {
    uVar2 = (ulong)uVar6;
    if (uVar2 < 0x29) {
      uVar6 = uVar6 + 8;
      ppvVar5 = (void **)((long)local_e8 + uVar2);
    }
    else {
      ppvVar5 = local_100;
      local_100 = local_100 + 1;
    }
    if ((char *)*ppvVar5 == (char *)0x0) break;
    strcat(__dest,(char *)*ppvVar5);
  }
  return __dest;
}

Assistant:

char *
string_join(const char *base, ...)
{
    va_list args;
    size_t len;
    const char *c;
    char *out;

    va_start(args, base);
    len = strlen(base);
    while ((c = va_arg(args, const char *)) != NULL) {
        len += strlen(c);
    }
    len++;
    va_end(args);

    out = ckd_calloc(len, 1);
    va_start(args, base);
    strcpy(out, base);
    while ((c = va_arg(args, const char *)) != NULL) {
        strcat(out, c);
    }
    va_end(args);

    return out;
}